

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_config(lysp_yang_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  size_t sVar1;
  ushort uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *format;
  ly_ctx *plVar5;
  char *pcVar6;
  bool bVar7;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  
  if ((*flags & 3) == 0) {
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
    sVar1 = word_len;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (word_len == 5) {
      iVar4 = strncmp(word,"false",5);
      if (iVar4 == 0) {
        uVar2 = 2;
        goto LAB_0016c9e4;
      }
    }
    else if ((word_len == 4) && (iVar4 = strncmp(word,"true",4), iVar4 == 0)) {
      uVar2 = 1;
LAB_0016c9e4:
      *flags = *flags | uVar2;
      free(buf);
      LVar3 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (kw == LY_STMT_SYNTAX_SEMICOLON) {
        bVar7 = true;
LAB_0016ca59:
        while( true ) {
          if (bVar7) {
            return LY_SUCCESS;
          }
          if (kw != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"config");
            return LY_EVALID;
          }
          LVar3 = parse_ext(ctx,word,word_len,flags,LY_STMT_CONFIG,0,exts);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          LVar3 = get_keyword(ctx,&kw,&word,&word_len);
          if (LVar3 != LY_SUCCESS) break;
          bVar7 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        return LVar3;
      }
      if (kw == LY_STMT_SYNTAX_LEFT_BRACE) {
        LVar3 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        bVar7 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        goto LAB_0016ca59;
      }
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = lyplg_ext_stmt2str(kw);
      format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
      goto LAB_0016c927;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
            sVar1 & 0xffffffff,word,"config");
    free(buf);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar6 = "config";
LAB_0016c927:
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_config(struct lysp_yang_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (*flags & LYS_CONFIG_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "config");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == ly_strlen_const("true")) && !strncmp(word, "true", word_len)) {
        *flags |= LYS_CONFIG_W;
    } else if ((word_len == ly_strlen_const("false")) && !strncmp(word, "false", word_len)) {
        *flags |= LYS_CONFIG_R;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "config");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, flags, LY_STMT_CONFIG, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "config");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}